

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O3

void __thiscall Linker::FixupCallMicrocode(Linker *this,uint microcode,uint oldGlobalSize)

{
  uint *puVar1;
  uint *puVar2;
  ExternModuleInfo *pEVar3;
  char *__function;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = (this->exRegVmConstants).count;
  if (microcode < uVar6) {
    puVar1 = (this->exRegVmConstants).data;
    puVar2 = (this->moduleRemap).data;
    pEVar3 = (this->exModules).data;
    do {
      if (puVar1[microcode] == 1) {
        uVar5 = microcode + 3;
        if (uVar5 < uVar6) {
          puVar2 = (this->moduleRemap).data;
          pEVar3 = (this->exModules).data;
          goto LAB_00294905;
        }
        break;
      }
      uVar5 = microcode + 1;
      switch(puVar1[microcode]) {
      case 2:
      case 3:
      case 4:
      case 5:
        uVar5 = microcode + 2;
        break;
      case 6:
        if (uVar6 <= uVar5) goto LAB_002949b2;
        if (puVar1[uVar5] == 0) {
          uVar5 = microcode + 2;
          if (uVar6 <= uVar5) goto LAB_002949b2;
          uVar6 = puVar1[uVar5];
          if (uVar6 < 0x1000000) {
            uVar6 = uVar6 + oldGlobalSize;
          }
          else {
            uVar4 = (uVar6 >> 0x18) - 1;
            if ((this->moduleRemap).count <= uVar4) goto LAB_002949b2;
            uVar4 = puVar2[uVar4];
            if ((this->exModules).count <= uVar4) goto LAB_002949d9;
            uVar6 = (uVar6 & 0xffffff) + pEVar3[uVar4].variableOffset;
          }
          puVar1[uVar5] = uVar6;
          uVar6 = (this->exRegVmConstants).count;
        }
        uVar5 = microcode + 4;
      }
      microcode = uVar5;
    } while (microcode < uVar6);
  }
  goto LAB_002949b2;
LAB_002949d9:
  __function = 
  "T &FastVector<ExternModuleInfo>::operator[](unsigned int) [T = ExternModuleInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
  goto LAB_002949c7;
  while (uVar5 = uVar7, uVar5 < uVar6) {
LAB_00294905:
    uVar4 = puVar1[uVar5];
    if (uVar4 == 7) {
      return;
    }
    if (uVar4 - 8 < 2) {
      uVar7 = uVar5 + 2;
    }
    else {
      uVar7 = uVar5 + 1;
      if (uVar4 == 10) {
        if (uVar6 <= uVar7) break;
        if (puVar1[uVar7] == 0) {
          uVar4 = uVar5 + 2;
          if (uVar6 <= uVar4) break;
          uVar6 = puVar1[uVar4];
          if (uVar6 < 0x1000000) {
            uVar6 = uVar6 + oldGlobalSize;
          }
          else {
            uVar7 = (uVar6 >> 0x18) - 1;
            if ((this->moduleRemap).count <= uVar7) break;
            uVar7 = puVar2[uVar7];
            if ((this->exModules).count <= uVar7) goto LAB_002949d9;
            uVar6 = (uVar6 & 0xffffff) + pEVar3[uVar7].variableOffset;
          }
          puVar1[uVar4] = uVar6;
          uVar6 = (this->exRegVmConstants).count;
        }
        uVar7 = uVar5 + 4;
      }
    }
  }
LAB_002949b2:
  __function = 
  "T &FastVector<unsigned int>::operator[](unsigned int) [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_002949c7:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,__function);
}

Assistant:

void Linker::FixupCallMicrocode(unsigned microcode, unsigned oldGlobalSize)
{
	while(exRegVmConstants[microcode] != rvmiCall)
	{
		switch(exRegVmConstants[microcode++])
		{
		case rvmiPush:
			microcode++;
			break;
		case rvmiPushQword:
			microcode++;
			break;
		case rvmiPushImm:
			microcode++;
			break;
		case rvmiPushImmq:
			microcode++;
			break;
		case rvmiPushMem:
			if(exRegVmConstants[microcode] == rvrrGlobals)
			{
				unsigned &offset = exRegVmConstants[microcode + 1];

				if(offset >> 24)
					offset = (offset & 0x00ffffff) + exModules[moduleRemap[(offset >> 24) - 1]].variableOffset;
				else
					offset += oldGlobalSize;
			}

			microcode += 3;
			break;
		}
	}

	microcode += 3;

	while(exRegVmConstants[microcode] != rvmiReturn)
	{
		switch(exRegVmConstants[microcode++])
		{
		case rvmiPop:
		case rvmiPopq:
			microcode++;
			break;
		case rvmiPopMem:
			if(exRegVmConstants[microcode] == rvrrGlobals)
			{
				unsigned &offset = exRegVmConstants[microcode + 1];

				if(offset >> 24)
					offset = (offset & 0x00ffffff) + exModules[moduleRemap[(offset >> 24) - 1]].variableOffset;
				else
					offset += oldGlobalSize;
			}

			microcode += 3;
			break;
		}
	}
}